

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzeqnarray.cpp
# Opt level: O3

void __thiscall
TPZEqnArray<std::complex<long_double>_>::EqnForward
          (TPZEqnArray<std::complex<long_double>_> *this,TPZFMatrix<std::complex<long_double>_> *F,
          DecomposeType dec)

{
  undefined8 *puVar1;
  longdouble lVar2;
  uint uVar3;
  complex<long_double> *pcVar4;
  ostream *poVar5;
  long *plVar6;
  int *piVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  unkbyte10 in_ST0;
  longdouble lVar15;
  unkbyte10 Var16;
  unkbyte10 in_ST1;
  unkbyte10 Var17;
  unkbyte10 in_ST2;
  unkbyte10 in_ST3;
  complex<long_double> __r;
  complex<long_double> udiag;
  complex<long_double> local_78;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  long local_38;
  
  if (this->fSymmetric == EIsSymmetric) {
    uVar13 = (ulong)(uint)this->fNumEq;
    if (0 < this->fNumEq) {
      uVar12 = 0;
      do {
        lVar15 = (longdouble)0;
        uVar3 = (this->fEqStart).super_TPZManVector<int,_100>.super_TPZVec<int>.fStore[uVar12];
        lVar9 = (long)(int)uVar3;
        pcVar4 = (this->fEqValues).super_TPZManVector<std::complex<long_double>,_1000>.
                 super_TPZVec<std::complex<long_double>_>.fStore;
        lVar10 = lVar9 * 0x20;
        lVar2 = *(longdouble *)(pcVar4[lVar9]._M_value + 0x10);
        if (*(longdouble *)pcVar4[lVar9]._M_value == lVar15) {
          if ((lVar2 == lVar15) && (!NAN(lVar2) && !NAN(lVar15))) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Diagonal Value = 0 >> Aborting on Index = ",0x2a);
            poVar5 = (ostream *)std::ostream::operator<<(&std::cout,uVar3);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5," Equation = ",0xc);
            plVar6 = (long *)std::ostream::operator<<(poVar5,(int)uVar12);
            std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
            std::ostream::put((char)plVar6);
            std::ostream::flush();
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Frontal/tpzeqnarray.cpp"
                       ,0x8b);
          }
        }
        if (uVar12 == (int)uVar13 - 1) {
          iVar8 = (int)(this->fEqValues).super_TPZManVector<std::complex<long_double>,_1000>.
                       super_TPZVec<std::complex<long_double>_>.fNElements;
        }
        else {
          iVar8 = (this->fEqStart).super_TPZManVector<int,_100>.super_TPZVec<int>.fStore[uVar12 + 1]
          ;
        }
        piVar7 = (this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>.fStore;
        lVar11 = (F->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fRow;
        lVar14 = (F->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fCol;
        Var16 = in_ST0;
        Var17 = in_ST1;
        local_38 = lVar10;
        if ((dec & ~ELUPivot) == ELU) {
          lVar10 = (long)piVar7[lVar9];
          if ((lVar14 < 1 || lVar10 < 0) || lVar11 <= lVar10) {
            TPZFMatrix<std::complex<long_double>_>::Error
                      ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          pcVar4 = F->fElem;
          Var16 = in_ST2;
          Var17 = in_ST3;
          in_ST2 = in_ST3;
          __divxc3();
          *(unkbyte10 *)pcVar4[lVar10]._M_value = in_ST0;
          *(unkbyte10 *)(pcVar4[lVar10]._M_value + 0x10) = in_ST1;
          piVar7 = (this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>.fStore;
          lVar11 = (F->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fRow;
          lVar14 = (F->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fCol;
        }
        lVar10 = (long)piVar7[lVar9];
        if (((lVar10 < 0) || (lVar11 <= lVar10)) || (lVar14 < 1)) {
          TPZFMatrix<std::complex<long_double>_>::Error
                    ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        pcVar4 = F->fElem + lVar10;
        local_58 = *(undefined8 *)pcVar4->_M_value;
        uStack_50 = *(undefined8 *)(pcVar4->_M_value + 8);
        puVar1 = (undefined8 *)(F->fElem[lVar10]._M_value + 0x10);
        local_48 = *puVar1;
        uStack_40 = puVar1[1];
        lVar10 = lVar9 + 1;
        if ((int)lVar10 < iVar8) {
          lVar11 = lVar10 * 0x20;
          iVar8 = ~uVar3 + iVar8;
          do {
            local_78._M_value._16_8_ = local_48;
            local_78._M_value._24_2_ = SUB82(uStack_40,0);
            local_78._M_value._26_6_ = SUB86((ulong)uStack_40 >> 0x10,0);
            local_78._M_value._0_8_ = local_58;
            local_78._M_value._8_2_ = SUB82(uStack_50,0);
            local_78._M_value._10_6_ = SUB86((ulong)uStack_50 >> 0x10,0);
            std::complex<long_double>::operator*=
                      (&local_78,
                       (complex<long_double> *)
                       (((this->fEqValues).super_TPZManVector<std::complex<long_double>,_1000>.
                         super_TPZVec<std::complex<long_double>_>.fStore)->_M_value + lVar11));
            lVar14 = (long)(this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>.fStore
                           [lVar10];
            if (((lVar14 < 0) ||
                ((F->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fRow <= lVar14
                )) || ((F->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fCol < 1
                      )) {
              TPZFMatrix<std::complex<long_double>_>::Error
                        ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            pcVar4 = F->fElem;
            lVar2 = *(longdouble *)(pcVar4[lVar14]._M_value + 0x10);
            *(longdouble *)pcVar4[lVar14]._M_value =
                 *(longdouble *)pcVar4[lVar14]._M_value -
                 (longdouble)CONCAT28(local_78._M_value._8_2_,local_78._M_value._0_8_);
            *(longdouble *)(pcVar4[lVar14]._M_value + 0x10) =
                 lVar2 - (longdouble)CONCAT28(local_78._M_value._24_2_,local_78._M_value._16_8_);
            lVar10 = lVar10 + 1;
            lVar11 = lVar11 + 0x20;
            iVar8 = iVar8 + -1;
          } while (iVar8 != 0);
        }
        in_ST0 = Var16;
        in_ST1 = Var17;
        if (dec == ELDLt) {
          lVar9 = (long)(this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>.fStore[lVar9]
          ;
          if (((lVar9 < 0) ||
              ((F->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fRow <= lVar9))
             || ((F->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<std::complex<long_double>_>::Error
                      ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          pcVar4 = F->fElem;
          in_ST0 = in_ST2;
          in_ST1 = in_ST3;
          in_ST2 = in_ST3;
          __divxc3();
          *(unkbyte10 *)pcVar4[lVar9]._M_value = Var16;
          *(unkbyte10 *)(pcVar4[lVar9]._M_value + 0x10) = Var17;
        }
        uVar12 = uVar12 + 1;
        uVar13 = (ulong)this->fNumEq;
      } while ((long)uVar12 < (long)uVar13);
    }
  }
  else if ((this->fSymmetric == EIsNonSymmetric) && (iVar8 = this->fNumEq, 1 < iVar8)) {
    uVar13 = 1;
    do {
      lVar15 = (longdouble)0;
      uVar3 = (this->fEqStart).super_TPZManVector<int,_100>.super_TPZVec<int>.fStore[uVar13];
      lVar9 = (long)(int)uVar3;
      pcVar4 = (this->fEqValues).super_TPZManVector<std::complex<long_double>,_1000>.
               super_TPZVec<std::complex<long_double>_>.fStore;
      lVar2 = *(longdouble *)(pcVar4[lVar9]._M_value + 0x10);
      if (*(longdouble *)pcVar4[lVar9]._M_value == lVar15) {
        if ((lVar2 == lVar15) && (!NAN(lVar2) && !NAN(lVar15))) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Diagonal Value = 0 >> Aborting on Index = ",0x2a);
          poVar5 = (ostream *)std::ostream::operator<<(&std::cout,uVar3);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5," Equation = ",0xc);
          plVar6 = (long *)std::ostream::operator<<(poVar5,(int)uVar13);
          std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
          std::ostream::put((char)plVar6);
          std::ostream::flush();
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Frontal/tpzeqnarray.cpp"
                     ,0xa5);
        }
      }
      if (uVar13 == iVar8 - 1) {
        iVar8 = (int)(this->fEqValues).super_TPZManVector<std::complex<long_double>,_1000>.
                     super_TPZVec<std::complex<long_double>_>.fNElements;
      }
      else {
        iVar8 = (this->fEqStart).super_TPZManVector<int,_100>.super_TPZVec<int>.fStore[uVar13 + 1];
      }
      piVar7 = (this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>.fStore;
      lVar10 = (F->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fRow;
      lVar11 = (F->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fCol;
      Var16 = in_ST0;
      Var17 = in_ST1;
      if ((dec & ~ELUPivot) == ELU) {
        lVar14 = (long)piVar7[lVar9];
        if ((lVar11 < 1 || lVar14 < 0) || lVar10 <= lVar14) {
          TPZFMatrix<std::complex<long_double>_>::Error
                    ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        pcVar4 = F->fElem;
        Var16 = in_ST2;
        Var17 = in_ST3;
        in_ST2 = in_ST3;
        __divxc3();
        *(unkbyte10 *)pcVar4[lVar14]._M_value = in_ST0;
        *(unkbyte10 *)(pcVar4[lVar14]._M_value + 0x10) = in_ST1;
        piVar7 = (this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>.fStore;
        lVar10 = (F->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fRow;
        lVar11 = (F->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fCol;
      }
      lVar14 = (long)piVar7[lVar9];
      if (((lVar14 < 0) || (lVar10 <= lVar14)) || (lVar11 < 1)) {
        TPZFMatrix<std::complex<long_double>_>::Error
                  ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      pcVar4 = F->fElem + lVar14;
      local_58 = *(undefined8 *)pcVar4->_M_value;
      uStack_50 = *(undefined8 *)(pcVar4->_M_value + 8);
      puVar1 = (undefined8 *)(F->fElem[lVar14]._M_value + 0x10);
      local_48 = *puVar1;
      uStack_40 = puVar1[1];
      lVar9 = lVar9 + 1;
      if ((int)lVar9 < iVar8) {
        lVar10 = lVar9 * 0x20;
        iVar8 = ~uVar3 + iVar8;
        do {
          local_78._M_value._16_8_ = local_48;
          local_78._M_value._24_2_ = SUB82(uStack_40,0);
          local_78._M_value._26_6_ = SUB86((ulong)uStack_40 >> 0x10,0);
          local_78._M_value._0_8_ = local_58;
          local_78._M_value._8_2_ = SUB82(uStack_50,0);
          local_78._M_value._10_6_ = SUB86((ulong)uStack_50 >> 0x10,0);
          std::complex<long_double>::operator*=
                    (&local_78,
                     (complex<long_double> *)
                     (((this->fEqValues).super_TPZManVector<std::complex<long_double>,_1000>.
                       super_TPZVec<std::complex<long_double>_>.fStore)->_M_value + lVar10));
          lVar11 = (long)(this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>.fStore
                         [lVar9];
          if (((lVar11 < 0) ||
              ((F->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fRow <= lVar11))
             || ((F->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<std::complex<long_double>_>::Error
                      ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          pcVar4 = F->fElem;
          lVar2 = *(longdouble *)(pcVar4[lVar11]._M_value + 0x10);
          *(longdouble *)pcVar4[lVar11]._M_value =
               *(longdouble *)pcVar4[lVar11]._M_value -
               (longdouble)CONCAT28(local_78._M_value._8_2_,local_78._M_value._0_8_);
          *(longdouble *)(pcVar4[lVar11]._M_value + 0x10) =
               lVar2 - (longdouble)CONCAT28(local_78._M_value._24_2_,local_78._M_value._16_8_);
          lVar9 = lVar9 + 1;
          lVar10 = lVar10 + 0x20;
          iVar8 = iVar8 + -1;
        } while (iVar8 != 0);
      }
      uVar13 = uVar13 + 2;
      iVar8 = this->fNumEq;
      in_ST0 = Var16;
      in_ST1 = Var17;
    } while ((int)uVar13 < iVar8);
  }
  return;
}

Assistant:

void TPZEqnArray<TVar>::EqnForward(TPZFMatrix<TVar> & F, DecomposeType dec) {
	int j;
	if(IsSymmetric()==EIsSymmetric){
		
		for(j=0; j<fNumEq; j++) {
			int index = fEqStart[j];
			if(fEqValues[index] == (TVar)0.) {
				cout << "Diagonal Value = 0 >> Aborting on Index = " << index << " Equation = " << j << endl;
				DebugStop();
			}
			int last_term;
			if(j==fNumEq-1){
				last_term=fEqValues.NElements();
			}else last_term = fEqStart[j+1];
			
			/** cholesky e lu */
			if(dec==ECholesky || dec==ELU) {
				F(fIndex[index],0) /= fEqValues[index];
			}
			/** ldlt cholesky lu */
			TVar udiag = F(fIndex[index],0);
			
			int i;
			//+1 ou +2
			for(i = index + 1; i < last_term; i++) F(fIndex[i],0) -= udiag * fEqValues[i];
			/** finalizacao para ldlt */
			if(dec == ELDLt) F(fIndex[index],0) /= fEqValues[index];
		}
	} else if(IsSymmetric()==EIsNonSymmetric) {
		for(j=1; j<fNumEq; j+=2) {
			int index = fEqStart[j];
			
			if(fEqValues[index] == (TVar)0.){
				cout << "Diagonal Value = 0 >> Aborting on Index = " << index << " Equation = " << j << endl;
				DebugStop();
			}          
			
			int last_term;
			if(j==fNumEq-1){
				last_term=fEqValues.NElements();
			}else last_term = fEqStart[j+1];
			//if(fEqStart.NElements()
			
			
			/** cholesky e lu */
			if(dec==ECholesky || dec==ELU) {
				F(fIndex[index],0) /= fEqValues[index];
			}
			/** ldlt cholesky lu */
			TVar udiag = F(fIndex[index],0);
			
			
			int i;
			for(i = index + 1; i < last_term; i++) F(fIndex[i],0) -= udiag * fEqValues[i];
		}
	}
}